

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

baseHolder * __thiscall
cs_impl::any::holder<std::shared_ptr<cs::context_type>_>::duplicate
          (holder<std::shared_ptr<cs::context_type>_> *this)

{
  holder<std::shared_ptr<cs::context_type>_> *phVar1;
  shared_ptr<cs::context_type> *in_stack_00000008;
  allocator_type<cs_impl::any::holder<std::shared_ptr<cs::context_type>_>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_00000010;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<std::shared_ptr<cs::context_type>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<std::shared_ptr<cs::context_type>&>(in_stack_00000010,in_stack_00000008);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}